

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O2

uc_afl_ret __thiscall UCAFL::_fksrv_start(UCAFL *this)

{
  __pid_t _Var1;
  int iVar2;
  afl_child_ret aVar3;
  ssize_t sVar4;
  char *pcVar5;
  __sighandler_t __handler;
  __pid_t unaff_R12D;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double __x_00;
  int status;
  int local_50;
  uint32_t was_killed;
  pid_t child_pid;
  uchar tmp [4];
  
  tmp[0] = '\0';
  tmp[1] = '\0';
  tmp[2] = '\0';
  tmp[3] = '\0';
  if (this->has_afl_ != true) {
    return UC_AFL_RET_NO_AFL;
  }
  if (this->afl_testcase_ptr_ != (uint32_t *)0x0) {
    local_50 = -0x7cffffff;
    sVar4 = write(199,&local_50,4);
    if (sVar4 != 4) {
      return UC_AFL_RET_NO_AFL;
    }
    in_XMM0_Qa = extraout_XMM0_Qa;
    if ((this->afl_testcase_ptr_ != (uint32_t *)0x0) &&
       (pcVar5 = getenv("__AFL_SHM_FUZZ_ID"), in_XMM0_Qa = extraout_XMM0_Qa_00,
       pcVar5 != (char *)0x0)) {
      sVar4 = read(0xc6,&local_50,4);
      __x_00 = extraout_XMM0_Qa_01;
      if ((sVar4 != 4) || (local_50 != -0x7effffff)) {
LAB_00103326:
        log(__x_00);
        return UC_AFL_RET_ERROR;
      }
      goto LAB_00103140;
    }
  }
  log(in_XMM0_Qa);
LAB_00103140:
  __handler = signal(0x11,(__sighandler_t)0x0);
  aVar3 = AFL_CHILD_EXITED;
  do {
    sVar4 = read(0xc6,&was_killed,4);
    if (sVar4 != 4) {
      return UC_AFL_RET_FINISHED;
    }
    if ((aVar3 == AFL_CHILD_EXITED) || (was_killed == 0)) {
      if (aVar3 == AFL_CHILD_EXITED) goto LAB_001031be;
      sVar4 = write(this->afl_parent_pipe_[1],tmp,4);
      __x_00 = extraout_XMM0_Qa_03;
      if (sVar4 != 4) goto LAB_00103326;
    }
    else {
      log(__x);
      _Var1 = waitpid(unaff_R12D,&status,0);
      __x_00 = extraout_XMM0_Qa_02;
      if (_Var1 < 0) goto LAB_00103326;
LAB_001031be:
      iVar2 = this->afl_child_pipe_[0];
      if (iVar2 != 0) {
        close(iVar2);
        close(this->afl_parent_pipe_[1]);
      }
      iVar2 = pipe(this->afl_child_pipe_);
      if (iVar2 != 0) {
        pcVar5 = "[!] Error creating pipe to child";
        goto LAB_0010337d;
      }
      iVar2 = pipe(this->afl_parent_pipe_);
      if (iVar2 != 0) {
        perror("[!] Error creating pipe to parent");
        close(this->afl_child_pipe_[0]);
        close(this->afl_child_pipe_[1]);
        return UC_AFL_RET_ERROR;
      }
      unaff_R12D = fork();
      child_pid = unaff_R12D;
      if (unaff_R12D < 0) {
        pcVar5 = "[!] Could not fork! ";
        goto LAB_0010337d;
      }
      if (unaff_R12D == 0) {
        signal(0x11,__handler);
        close(0xc6);
        close(199);
        close(this->afl_child_pipe_[0]);
        close(this->afl_parent_pipe_[1]);
        memset(this->afl_area_ptr_,0,0x10000);
        this->afl_prev_loc_ = 0;
        *this->afl_area_ptr_ = '\x01';
        return UC_AFL_RET_CHILD;
      }
      close(this->afl_child_pipe_[1]);
      close(this->afl_parent_pipe_[0]);
    }
    sVar4 = write(199,&child_pid,4);
    if (sVar4 != 4) {
      return UC_AFL_RET_FINISHED;
    }
    aVar3 = _handle_child_requests(this);
    if (aVar3 == AFL_CHILD_EXITED) {
      _Var1 = waitpid(unaff_R12D,&status,0);
      if (_Var1 < 0) {
        pcVar5 = "[!] The child\'s exit code could not be determined. ";
LAB_0010337d:
        perror(pcVar5);
        return UC_AFL_RET_ERROR;
      }
    }
    else if (aVar3 == AFL_CHILD_FOUND_CRASH) {
      status = this->wifsignaled_;
    }
    else if (aVar3 == AFL_CHILD_NEXT) {
      status = 0;
    }
    sVar4 = write(199,&status,4);
    if (sVar4 != 4) {
      return UC_AFL_RET_FINISHED;
    }
  } while( true );
}

Assistant:

uc_afl_ret _fksrv_start() {
        unsigned char tmp[4] = {0};
        pid_t child_pid;
        enum afl_child_ret child_ret = AFL_CHILD_EXITED;
        bool first_round = true;
        uint32_t status = 0;

        if (!this->has_afl_)
            return UC_AFL_RET_NO_AFL;

        if (this->afl_testcase_ptr_) {
            /* Parent supports testcases via shared map - and the user wants to
             * use it. Tell AFL. */
            status = (FS_OPT_ENABLED | FS_OPT_SHDMEM_FUZZ | FS_OPT_NEWCMPLOG);
            /* Phone home and tell the parent that we're OK. If parent isn't
               there, assume we're not running in forkserver mode and just
               execute program. */
            if (write(FORKSRV_FD + 1, &status, 4) != 4)
                return UC_AFL_RET_NO_AFL;
        }

        /* afl tells us in an extra message if it accepted this option or not */
        if (this->afl_testcase_ptr_ && getenv(SHM_FUZZ_ENV_VAR)) {
            if (read(FORKSRV_FD, &status, 4) != 4) {
                ERR("AFL parent exited before forkserver was up\n");
                return UC_AFL_RET_ERROR;
            }
            if (status != (FS_OPT_ENABLED | FS_OPT_SHDMEM_FUZZ)) {
                ERR("Unexpected response from AFL++ on forkserver setup\n");
                return UC_AFL_RET_ERROR;
            }
        } else {
            ERR("AFL++ sharedmap fuzzing not supported/SHM_FUZZ_ENV_VAR not "
                "set\n");
        }

        void (*old_sigchld_handler)(int) = signal(SIGCHLD, SIG_DFL);

        while (1) {

            uint32_t was_killed;
            int status;

            /* Wait for parent by reading from the pipe. Abort if read fails. */

            // See _uc_afl_next
            if (read(FORKSRV_FD, &was_killed, 4) != 4)
                return UC_AFL_RET_FINISHED;

            /* If we stopped the child in persistent mode, but there was a race
            condition and afl-fuzz already issued SIGKILL, write off the old
            process. */

            if ((child_ret != AFL_CHILD_EXITED) && was_killed) {

                ERR("Child was killed by AFL in the meantime.\n");

                child_ret = AFL_CHILD_EXITED;
                if (waitpid(child_pid, &status, 0) < 0) {
                    ERR("Error waiting for child!");
                    return UC_AFL_RET_ERROR;
                }
            }

            if (child_ret == AFL_CHILD_EXITED) {

                /* Child dead. Establish new a channel with child to grab
                   translation commands. We'll read from _R(afl_child_pipe),
                   child will write to _W(afl_child_pipe). */

                /* close the read fd of previous round. */

                if (_R(this->afl_child_pipe_)) {
                    close(_R(this->afl_child_pipe_));
                    close(_W(this->afl_parent_pipe_));
                }

                if (pipe(this->afl_child_pipe_)) {
                    perror("[!] Error creating pipe to child");
                    return UC_AFL_RET_ERROR;
                }
                if (pipe(this->afl_parent_pipe_)) {
                    perror("[!] Error creating pipe to parent");
                    close(_R(this->afl_child_pipe_));
                    close(_W(this->afl_child_pipe_));
                    return UC_AFL_RET_ERROR;
                }

                /* Create a clone of our process. */

                child_pid = fork();
                if (child_pid < 0) {
                    perror("[!] Could not fork! ");
                    return UC_AFL_RET_ERROR;
                }

                /* In child process: close fds, resume execution. */

                if (!child_pid) { // New child

                    signal(SIGCHLD, old_sigchld_handler);
                    // FORKSRV_FD is for communication with AFL, we don't need
                    // it in the child.
                    close(FORKSRV_FD);
                    close(FORKSRV_FD + 1);
                    close(_R(this->afl_child_pipe_));
                    close(_W(this->afl_parent_pipe_));

                    memset(this->afl_area_ptr_, 0, MAP_SIZE);
                    mem_barrier(); // Make very sure everything has been written
                                   // to the map at this point

                    if (!first_round) {

                        // For persistent mode: Clear the map manually after
                        // forks.
                        memset(this->afl_area_ptr_, 0, MAP_SIZE);

                    } else {

                        first_round = false;
                    }

                    this->afl_prev_loc_ = 0;
                    // Tell AFL we're alive
                    this->afl_area_ptr_[0] = 1;

                    return UC_AFL_RET_CHILD;

                } else { // parent for new child

                    /* If we don't close this in parent, we don't get notified
                     * on afl_child_pipe once child is gone. */

                    close(_W(this->afl_child_pipe_));
                    close(_R(this->afl_parent_pipe_));
                }

            } else { // parent, in persistent mode

                /* Special handling for persistent mode: if the child is alive
                   but currently stopped, simply restart it with a write to
                   afl_parent_pipe. In case we fuzz using shared map, use this
                   method to forward the size of the current testcase to the
                   child without cost. */

                // See _uc_afl_next
                if (write(_W(this->afl_parent_pipe_), tmp, 4) != 4) {

                    ERR("Child died when we tried to resume it\n");
                    return UC_AFL_RET_ERROR;
                }
            }

            /* In parent process: write PID to AFL. */

            if (write(FORKSRV_FD + 1, &child_pid, 4) != 4) {
                return UC_AFL_RET_FINISHED;
            }

            /* Collect translation requests until child finishes a run or dies
             */

            child_ret = this->_handle_child_requests();

            if (child_ret == AFL_CHILD_NEXT) {

                /* Child asks for next in persistent mode  */

                // This status tells AFL we are not crashed.
                status = 0;

            } else if (child_ret == AFL_CHILD_FOUND_CRASH) {

                /* WIFSIGNALED(wifsignaled) == 1 -> tells AFL the child crashed
                 * (even though it's still alive for persistent mode) */

                status = this->wifsignaled_;

            } else if (child_ret == AFL_CHILD_EXITED) {

                /* If child exited, get and relay exit status to parent through
                 * waitpid. */

                if (waitpid(child_pid, &status, 0) < 0) {

                    // Zombie Child could not be collected. Scary!
                    perror(
                        "[!] The child's exit code could not be determined. ");
                    return UC_AFL_RET_ERROR;
                }
            }

            /* Relay wait status to AFL pipe, then loop back. */

            if (write(FORKSRV_FD + 1, &status, 4) != 4)
                return UC_AFL_RET_FINISHED;
        }
    }